

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point_Object_State_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Point_Object_State_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Point_Object_State_PDU *this)

{
  ostream *poVar1;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  KStringStream ss;
  KString local_2e0;
  KString local_2c0;
  KString local_2a0;
  KString local_280;
  KString local_260;
  KString local_240;
  KString local_220;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"-Point Object State PDU-\n");
  Object_State_Header::GetAsString_abi_cxx11_(&local_1e0,&this->super_Object_State_Header);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,"Modification:\n");
  poVar1 = std::operator<<(poVar1,"\tLocation:     ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(byte)(this->super_Object_State_Header).field_0x4b & 1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tOrientation:  ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(byte)(this->super_Object_State_Header).field_0x4b >> 1 & 1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Object Type:  ");
  DATA_TYPE::ObjectType::GetAsString_abi_cxx11_(&local_200,&this->m_ObjTyp);
  poVar1 = std::operator<<(poVar1,(string *)&local_200);
  poVar1 = std::operator<<(poVar1,"Location:     ");
  DATA_TYPE::WorldCoordinates::GetAsString_abi_cxx11_(&local_220,&this->m_Loc);
  poVar1 = std::operator<<(poVar1,(string *)&local_220);
  poVar1 = std::operator<<(poVar1,"Orientation:  ");
  DATA_TYPE::EulerAngles::GetAsString_abi_cxx11_(&local_240,&this->m_Ori);
  poVar1 = std::operator<<(poVar1,(string *)&local_240);
  poVar1 = std::operator<<(poVar1,"Requestor ID:\n");
  DATA_TYPE::SimulationIdentifier::GetAsString_abi_cxx11_(&local_280,&this->m_ReqID);
  UTILS::IndentString(&local_260,&local_280,Tabs,in_CL);
  poVar1 = std::operator<<(poVar1,(string *)&local_260);
  DATA_TYPE::PointObjectAppearance::GetAsString_abi_cxx11_(&local_2a0,&this->m_Apperance);
  poVar1 = std::operator<<(poVar1,(string *)&local_2a0);
  poVar1 = std::operator<<(poVar1,"Receiving ID:\n");
  DATA_TYPE::SimulationIdentifier::GetAsString_abi_cxx11_(&local_2e0,&this->m_RecvID);
  UTILS::IndentString(&local_2c0,&local_2e0,Tabs_00,in_CL);
  std::operator<<(poVar1,(string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Point_Object_State_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Point Object State PDU-\n"
       << Object_State_Header::GetAsString()
       << "Modification:\n"
       << "\tLocation:     " << ( KUINT16 )m_ModificationUnion.m_ui8LocBit << "\n"
       << "\tOrientation:  " << ( KUINT16 )m_ModificationUnion.m_ui8OriBit << "\n"
       << "Object Type:  "   << m_ObjTyp.GetAsString()
       << "Location:     "   << m_Loc.GetAsString()
       << "Orientation:  "   << m_Ori.GetAsString()
       << "Requestor ID:\n"  << IndentString( m_ReqID.GetAsString(), 1 )
       << m_Apperance.GetAsString()
       << "Receiving ID:\n"  << IndentString( m_RecvID.GetAsString(), 1 );

    return ss.str();
}